

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     SpecializeArgMinMaxNFunction<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>
               (AggregateFunction *function)

{
  AggregateFunction *function_local;
  
  function->state_size =
       AggregateFunction::
       StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
  ;
  function->initialize =
       AggregateFunction::
       StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
  ;
  function->combine =
       AggregateFunction::
       StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
  ;
  function->destructor =
       AggregateFunction::
       StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
  ;
  function->finalize =
       MinMaxNOperation::
       Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
  ;
  function->update =
       ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
  ;
  return;
}

Assistant:

static void SpecializeArgMinMaxNFunction(AggregateFunction &function) {
	using STATE = ArgMinMaxNState<VAL_TYPE, ARG_TYPE, COMPARATOR>;
	using OP = MinMaxNOperation;

	function.state_size = AggregateFunction::StateSize<STATE>;
	function.initialize = AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>;
	function.combine = AggregateFunction::StateCombine<STATE, OP>;
	function.destructor = AggregateFunction::StateDestroy<STATE, OP>;

	function.finalize = MinMaxNOperation::Finalize<STATE>;
	function.update = ArgMinMaxNUpdate<STATE>;
}